

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLiteral.c
# Opt level: O0

DdNode * Cudd_bddLiteralSetIntersection(DdManager *dd,DdNode *f,DdNode *g)

{
  DdNode *pDVar1;
  DdNode *res;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddBddLiteralSetIntersectionRecur(dd,f,g);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_bddLiteralSetIntersection(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = cuddBddLiteralSetIntersectionRecur(dd,f,g);
    } while (dd->reordered == 1);
    return(res);

}